

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O2

uint64_t basisu::pack_astc_range7_2bit_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined8 in_RAX;
  long lVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  undefined8 uStack_40;
  undefined7 uStack_38;
  color_quad_u8 p;
  
  if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4)) {
    uVar1 = g_astc_range7_2bit_optimal_endpoints[(ulong)g * 4 + 2];
    uVar2 = g_astc_range7_2bit_optimal_endpoints[(ulong)b * 4 + 2];
    (pResults->m_low_endpoint).m_c[0] = g_astc_range7_2bit_optimal_endpoints[(ulong)r * 4 + 2];
    (pResults->m_low_endpoint).m_c[1] = uVar1;
    (pResults->m_low_endpoint).m_c[2] = uVar2;
    (pResults->m_low_endpoint).m_c[3] = '\0';
    uVar1 = g_astc_range7_2bit_optimal_endpoints[(ulong)g * 4 + 3];
    uVar2 = g_astc_range7_2bit_optimal_endpoints[(ulong)b * 4 + 3];
    (pResults->m_high_endpoint).m_c[0] = g_astc_range7_2bit_optimal_endpoints[(ulong)r * 4 + 3];
    (pResults->m_high_endpoint).m_c[1] = uVar1;
    (pResults->m_high_endpoint).m_c[2] = uVar2;
    *(undefined8 *)((pResults->m_high_endpoint).m_c + 3) = 0;
    *(undefined1 *)((long)pResults->m_pbits + 7) = 0;
    for (lVar5 = 0x2c; lVar5 != 0x30; lVar5 = lVar5 + 1) {
      *(undefined *)((long)(&pResults->m_low_endpoint + -3) + lVar5) =
           (&DAT_00362021)
           [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -0xb) + lVar5) * 2 +
            (ulong)pParams->m_astc_endpoint_range * 0x200];
      *(undefined *)
       ((long)&((color_cell_compressor_results *)(&pResults->m_low_endpoint + -2))->
               m_best_overall_err + lVar5) =
           (&DAT_00362021)
           [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -10) + lVar5) * 2 +
            (ulong)pParams->m_astc_endpoint_range * 0x200];
    }
    uStack_40 = (code *)0x20ba7c;
    _uStack_38 = in_RAX;
    memset(pSelectors,1,(ulong)pParams->m_num_pixels);
    for (lVar5 = 8; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      uStack_40 = (code *)0x20bab4;
      uVar4 = astc_interpolate_linear
                        ((uint)(byte)(&DAT_00362e20)
                                     [(ulong)*(byte *)((long)&((color_cell_compressor_results *)
                                                              (&pResults->m_low_endpoint + -2))->
                                                              m_best_overall_err + lVar5) * 2],
                         (uint)(byte)(&DAT_00362e20)
                                     [(ulong)*(byte *)((long)(&pResults->m_low_endpoint + -1) +
                                                      lVar5) * 2],0x15);
      *(char *)((long)&uStack_40 + lVar5 + 4) = (char)uVar4;
    }
    _uStack_38 = CONCAT17(0xff,uStack_38);
    uVar3 = pParams->m_num_pixels;
    uVar7 = 0;
    for (lVar5 = 0; (ulong)uVar3 << 2 != lVar5; lVar5 = lVar5 + 4) {
      uStack_40 = (code *)0x20baf6;
      uVar6 = compute_color_distance_rgb
                        (&p,(color_quad_u8 *)(pParams->m_pPixels->m_c + lVar5),pParams->m_perceptual
                         ,pParams->m_weights);
      uVar7 = uVar7 + uVar6;
    }
    pResults->m_best_overall_err = uVar7;
    return uVar7;
  }
  uStack_40 = pack_astc_4bit_2bit_to_one_color_rgba;
  __assert_fail("pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                ,0x2c1,
                "uint64_t basisu::pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *, color_cell_compressor_results *, uint32_t, uint32_t, uint32_t, uint8_t *)"
               );
}

Assistant:

static uint64_t pack_astc_range7_2bit_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	assert(pParams->m_astc_endpoint_range == 7 && pParams->m_num_selector_weights == 4);

	const endpoint_err *pEr = &g_astc_range7_2bit_optimal_endpoints[r];
	const endpoint_err *pEg = &g_astc_range7_2bit_optimal_endpoints[g];
	const endpoint_err *pEb = &g_astc_range7_2bit_optimal_endpoints[b];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = 0;
	pResults->m_pbits[1] = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		pResults->m_astc_low_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_low_endpoint.m_c[i]].m_index;
		pResults->m_astc_high_endpoint.m_c[i] = g_astc_sorted_order_unquant[pParams->m_astc_endpoint_range][pResults->m_high_endpoint.m_c[i]].m_index;
	}

	memset(pSelectors, BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = g_astc_sorted_order_unquant[7][pResults->m_low_endpoint.m_c[i]].m_unquant;
		uint32_t high = g_astc_sorted_order_unquant[7][pResults->m_high_endpoint.m_c[i]].m_unquant;
		
		p.m_c[i] = (uint8_t)astc_interpolate_linear(low, high, g_bc7_weights2[BC7ENC_ASTC_RANGE7_2BIT_OPTIMAL_INDEX]);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}